

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-test.c++
# Opt level: O0

void __thiscall capnp::_::anon_unknown_0::TestCase331::run(TestCase331 *this)

{
  bool bVar1;
  anon_class_8_1_89912de0 *extraout_RDX;
  anon_class_8_1_89912de0 *extraout_RDX_00;
  anon_class_8_1_89912de0 *func;
  anon_class_8_1_89912de0 *extraout_RDX_01;
  anon_class_8_1_89912de0 *func_00;
  ArrayPtr<const_char> AVar2;
  bool local_13b1;
  undefined1 auStack_13b0 [7];
  bool _kj_shouldLog_5;
  Maybe<kj::Exception> local_13a8;
  DebugExpression<kj::Maybe<kj::Exception>_> local_1210;
  undefined1 local_1078 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_9;
  undefined1 auStack_eb8 [7];
  bool _kj_shouldLog_4;
  Maybe<kj::Exception> local_eb0;
  DebugExpression<kj::Maybe<kj::Exception>_> local_d18;
  undefined1 local_b80 [8];
  DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> _kjCondition_8;
  int64_t local_998;
  longlong local_990;
  bool local_981;
  undefined1 local_980 [7];
  bool _kj_shouldLog_3;
  int64_t local_950;
  longlong local_948;
  DebugExpression<long_long> local_940;
  undefined1 local_938 [8];
  DebugComparison<long_long,_long> _kjCondition_7;
  Which local_8dc [2];
  Fault local_8d8;
  Fault f_3;
  Which local_89e [2];
  DebugExpression<capnproto_test::capnp::test::TestUnion::Union3::Which> local_89a;
  undefined1 local_898 [8];
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,_capnproto_test::capnp::test::TestUnion::Union3::Which>
  _kjCondition_6;
  undefined1 local_870 [7];
  bool _kj_shouldLog_2;
  bool local_83a;
  DebugExpression<bool> local_839;
  undefined1 local_838 [7];
  DebugExpression<bool> _kjCondition_5;
  Which local_804;
  Which local_802;
  Fault local_800;
  Fault f_2;
  Which local_7c6;
  Which local_7c4;
  DebugExpression<capnproto_test::capnp::test::TestUnion::Union2::Which> local_7c2;
  undefined1 local_7c0 [8];
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,_capnproto_test::capnp::test::TestUnion::Union2::Which>
  _kjCondition_4;
  ArrayPtr<const_char> local_770;
  bool local_759;
  undefined1 local_758 [7];
  bool _kj_shouldLog_1;
  ArrayPtr<const_char> local_728;
  char (*local_718) [4];
  undefined1 local_710 [8];
  DebugComparison<const_char_(&)[4],_capnp::Text::Reader> _kjCondition_3;
  Which local_6ac [2];
  Fault local_6a8;
  Fault f_1;
  Which local_66e;
  Which local_66c;
  DebugExpression<capnproto_test::capnp::test::TestUnion::Union1::Which> local_66a;
  undefined1 local_668 [8];
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,_capnproto_test::capnp::test::TestUnion::Union1::Which>
  _kjCondition_2;
  int32_t local_614;
  int local_610;
  bool local_609;
  undefined1 local_608 [7];
  bool _kj_shouldLog;
  int32_t local_5d4;
  int local_5d0;
  DebugExpression<int> local_5cc;
  undefined1 local_5c8 [8];
  DebugComparison<int,_int> _kjCondition_1;
  Which local_574 [2];
  Fault local_570;
  Fault f;
  Which local_536 [2];
  DebugExpression<capnproto_test::capnp::test::TestUnion::Union0::Which> local_532;
  undefined1 local_530 [8];
  DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,_capnproto_test::capnp::test::TestUnion::Union0::Which>
  _kjCondition;
  undefined1 local_4d8 [8];
  Reader reader;
  ArrayPtr<const_char> local_460;
  ArrayPtr<const_char> local_450;
  Builder local_440;
  BuilderFor<capnp::DynamicStruct> local_400;
  Reader local_3d0;
  ArrayPtr<const_char> local_388;
  ArrayPtr<const_char> local_378;
  Builder local_368;
  BuilderFor<capnp::DynamicStruct> local_328;
  Reader local_2f8;
  ArrayPtr<const_char> local_2b0;
  ArrayPtr<const_char> local_2a0;
  Builder local_290;
  BuilderFor<capnp::DynamicStruct> local_250;
  Reader local_220;
  ArrayPtr<const_char> local_1d8;
  ArrayPtr<const_char> local_1c8;
  Builder local_1b8;
  BuilderFor<capnp::DynamicStruct> local_178;
  Schema local_138;
  undefined1 local_130 [8];
  Builder root;
  MallocMessageBuilder builder;
  TestCase331 *this_local;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&root.builder.dataSize,0x400,GROW_HEURISTICALLY);
  local_138.raw = (RawBrandedSchema *)Schema::from<capnproto_test::capnp::test::TestUnion>();
  MessageBuilder::initRoot<capnp::DynamicStruct,capnp::StructSchema>
            ((Builder *)local_130,(MessageBuilder *)&root.builder.dataSize,
             (StructSchema)local_138.raw);
  kj::StringPtr::StringPtr((StringPtr *)&local_1c8,"union0");
  DynamicStruct::Builder::get(&local_1b8,(Builder *)local_130,(StringPtr)local_1c8);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_178,&local_1b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_1d8,"u0f1s32");
  DynamicValue::Reader::Reader(&local_220,0x12d687);
  DynamicStruct::Builder::set(&local_178,(StringPtr)local_1d8,&local_220);
  DynamicValue::Reader::~Reader(&local_220);
  DynamicValue::Builder::~Builder(&local_1b8);
  kj::StringPtr::StringPtr((StringPtr *)&local_2a0,"union1");
  DynamicStruct::Builder::get(&local_290,(Builder *)local_130,(StringPtr)local_2a0);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_250,&local_290);
  kj::StringPtr::StringPtr((StringPtr *)&local_2b0,"u1f1sp");
  DynamicValue::Reader::Reader(&local_2f8,"foo");
  DynamicStruct::Builder::set(&local_250,(StringPtr)local_2b0,&local_2f8);
  DynamicValue::Reader::~Reader(&local_2f8);
  DynamicValue::Builder::~Builder(&local_290);
  kj::StringPtr::StringPtr((StringPtr *)&local_378,"union2");
  DynamicStruct::Builder::get(&local_368,(Builder *)local_130,(StringPtr)local_378);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_328,&local_368);
  kj::StringPtr::StringPtr((StringPtr *)&local_388,"u2f0s1");
  DynamicValue::Reader::Reader(&local_3d0,true);
  DynamicStruct::Builder::set(&local_328,(StringPtr)local_388,&local_3d0);
  DynamicValue::Reader::~Reader(&local_3d0);
  DynamicValue::Builder::~Builder(&local_368);
  kj::StringPtr::StringPtr((StringPtr *)&local_450,"union3");
  DynamicStruct::Builder::get(&local_440,(Builder *)local_130,(StringPtr)local_450);
  DynamicValue::Builder::as<capnp::DynamicStruct>(&local_400,&local_440);
  kj::StringPtr::StringPtr((StringPtr *)&local_460,"u3f0s64");
  DynamicValue::Reader::Reader((Reader *)&reader._reader.nestingLimit,0x112210f47de98115);
  DynamicStruct::Builder::set
            (&local_400,(StringPtr)local_460,(Reader *)&reader._reader.nestingLimit);
  DynamicValue::Reader::~Reader((Reader *)&reader._reader.nestingLimit);
  DynamicValue::Builder::~Builder(&local_440);
  DynamicStruct::Builder::asReader((Reader *)&_kjCondition.result,(Builder *)local_130);
  DynamicStruct::Reader::as<capnproto_test::capnp::test::TestUnion>
            ((Reader *)local_4d8,(Reader *)&_kjCondition.result);
  local_536[1] = 0xb;
  local_532 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_536 + 1);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion0((Reader *)&f,(Reader *)local_4d8);
  local_536[0] = capnproto_test::capnp::test::TestUnion::Union0::Reader::which((Reader *)&f);
  kj::_::DebugExpression<capnproto_test::capnp::test::TestUnion::Union0::Which>::operator==
            ((DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,_capnproto_test::capnp::test::TestUnion::Union0::Which>
              *)local_530,&local_532,local_536);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_530);
  if (!bVar1) {
    local_574[1] = 0xb;
    capnproto_test::capnp::test::TestUnion::Reader::getUnion0
              ((Reader *)&_kjCondition_1.result,(Reader *)local_4d8);
    local_574[0] = capnproto_test::capnp::test::TestUnion::Union0::Reader::which
                             ((Reader *)&_kjCondition_1.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>&,capnproto_test::capnp::test::TestUnion::Union0::Which,capnproto_test::capnp::test::TestUnion::Union0::Which>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x155,FAILED,"(TestUnion::Union0::U0F1S32) == (reader.getUnion0().which())",
               "_kjCondition,TestUnion::Union0::U0F1S32, reader.getUnion0().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union0::Which,_capnproto_test::capnp::test::TestUnion::Union0::Which>
                *)local_530,local_574 + 1,local_574);
    kj::_::Debug::Fault::fatal(&local_570);
  }
  local_5d0 = 0x12d687;
  local_5cc = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_5d0);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion0((Reader *)local_608,(Reader *)local_4d8)
  ;
  local_5d4 = capnproto_test::capnp::test::TestUnion::Union0::Reader::getU0f1s32
                        ((Reader *)local_608);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int> *)local_5c8,&local_5cc,&local_5d4);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_5c8);
  if (!bVar1) {
    local_609 = kj::_::Debug::shouldLog(ERROR);
    while (local_609 != false) {
      local_610 = 0x12d687;
      capnproto_test::capnp::test::TestUnion::Reader::getUnion0
                ((Reader *)&_kjCondition_2.result,(Reader *)local_4d8);
      local_614 = capnproto_test::capnp::test::TestUnion::Union0::Reader::getU0f1s32
                            ((Reader *)&_kjCondition_2.result);
      kj::_::Debug::log<char_const(&)[64],kj::_::DebugComparison<int,int>&,int,int>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x156,ERROR,
                 "\"failed: expected \" \"(1234567) == (reader.getUnion0().getU0f1s32())\", _kjCondition, 1234567, reader.getUnion0().getU0f1s32()"
                 ,(char (*) [64])"failed: expected (1234567) == (reader.getUnion0().getU0f1s32())",
                 (DebugComparison<int,_int> *)local_5c8,&local_610,&local_614);
      local_609 = false;
    }
  }
  local_66c._0_1_ = '\f';
  local_66c._1_1_ = '\0';
  local_66a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_66c);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion1((Reader *)&f_1,(Reader *)local_4d8);
  local_66e = capnproto_test::capnp::test::TestUnion::Union1::Reader::which((Reader *)&f_1);
  kj::_::DebugExpression<capnproto_test::capnp::test::TestUnion::Union1::Which>::operator==
            ((DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,_capnproto_test::capnp::test::TestUnion::Union1::Which>
              *)local_668,&local_66a,&local_66e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_668);
  if (!bVar1) {
    local_6ac[1] = 0xc;
    capnproto_test::capnp::test::TestUnion::Reader::getUnion1
              ((Reader *)&_kjCondition_3.result,(Reader *)local_4d8);
    local_6ac[0] = capnproto_test::capnp::test::TestUnion::Union1::Reader::which
                             ((Reader *)&_kjCondition_3.result);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>&,capnproto_test::capnp::test::TestUnion::Union1::Which,capnproto_test::capnp::test::TestUnion::Union1::Which>
              (&local_6a8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x158,FAILED,"(TestUnion::Union1::U1F1SP) == (reader.getUnion1().which())",
               "_kjCondition,TestUnion::Union1::U1F1SP, reader.getUnion1().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union1::Which,_capnproto_test::capnp::test::TestUnion::Union1::Which>
                *)local_668,local_6ac + 1,local_6ac);
    kj::_::Debug::Fault::fatal(&local_6a8);
  }
  local_718 = (char (*) [4])
              kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char (*) [4])"foo");
  capnproto_test::capnp::test::TestUnion::Reader::getUnion1((Reader *)local_758,(Reader *)local_4d8)
  ;
  local_728 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f1sp((Reader *)local_758)
  ;
  kj::_::DebugExpression<char_const(&)[4]>::operator==
            ((DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_710,
             (DebugExpression<char_const(&)[4]> *)&local_718,(Reader *)&local_728);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_710);
  if (!bVar1) {
    local_759 = kj::_::Debug::shouldLog(ERROR);
    while (local_759 != false) {
      capnproto_test::capnp::test::TestUnion::Reader::getUnion1
                ((Reader *)&_kjCondition_4.result,(Reader *)local_4d8);
      AVar2 = (ArrayPtr<const_char>)
              capnproto_test::capnp::test::TestUnion::Union1::Reader::getU1f1sp
                        ((Reader *)&_kjCondition_4.result);
      local_770 = AVar2;
      kj::_::Debug::
      log<char_const(&)[61],kj::_::DebugComparison<char_const(&)[4],capnp::Text::Reader>&,char_const(&)[4],capnp::Text::Reader>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x159,ERROR,
                 "\"failed: expected \" \"(\\\"foo\\\") == (reader.getUnion1().getU1f1sp())\", _kjCondition, \"foo\", reader.getUnion1().getU1f1sp()"
                 ,(char (*) [61])"failed: expected (\"foo\") == (reader.getUnion1().getU1f1sp())",
                 (DebugComparison<const_char_(&)[4],_capnp::Text::Reader> *)local_710,
                 (char (*) [4])"foo",(Reader *)&local_770);
      local_759 = false;
    }
  }
  local_7c4._0_1_ = '\0';
  local_7c4._1_1_ = '\0';
  local_7c2 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7c4);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion2((Reader *)&f_2,(Reader *)local_4d8);
  local_7c6 = capnproto_test::capnp::test::TestUnion::Union2::Reader::which((Reader *)&f_2);
  kj::_::DebugExpression<capnproto_test::capnp::test::TestUnion::Union2::Which>::operator==
            ((DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,_capnproto_test::capnp::test::TestUnion::Union2::Which>
              *)local_7c0,&local_7c2,&local_7c6);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_7c0);
  if (!bVar1) {
    local_802._0_1_ = '\0';
    local_802._1_1_ = '\0';
    capnproto_test::capnp::test::TestUnion::Reader::getUnion2
              ((Reader *)local_838,(Reader *)local_4d8);
    local_804 = capnproto_test::capnp::test::TestUnion::Union2::Reader::which((Reader *)local_838);
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>&,capnproto_test::capnp::test::TestUnion::Union2::Which,capnproto_test::capnp::test::TestUnion::Union2::Which>
              (&local_800,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
               ,0x15b,FAILED,"(TestUnion::Union2::U2F0S1) == (reader.getUnion2().which())",
               "_kjCondition,TestUnion::Union2::U2F0S1, reader.getUnion2().which()",
               (DebugComparison<capnproto_test::capnp::test::TestUnion::Union2::Which,_capnproto_test::capnp::test::TestUnion::Union2::Which>
                *)local_7c0,&local_802,&local_804);
    kj::_::Debug::Fault::fatal(&local_800);
  }
  capnproto_test::capnp::test::TestUnion::Reader::getUnion2((Reader *)local_870,(Reader *)local_4d8)
  ;
  local_83a = capnproto_test::capnp::test::TestUnion::Union2::Reader::getU2f0s1((Reader *)local_870)
  ;
  local_839 = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_83a);
  bVar1 = kj::_::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_839);
  if (!bVar1) {
    _kjCondition_6._31_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_6._31_1_ != '\0') {
      kj::_::Debug::log<char_const(&)[48],kj::_::DebugExpression<bool>&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                 ,0x15c,ERROR,
                 "\"failed: expected \" \"reader.getUnion2().getU2f0s1()\", _kjCondition",
                 (char (*) [48])"failed: expected reader.getUnion2().getU2f0s1()",&local_839);
      _kjCondition_6._31_1_ = 0;
    }
  }
  local_89e[1] = 4;
  local_89a = kj::_::DebugExpressionStart::operator<<
                        ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,local_89e + 1);
  capnproto_test::capnp::test::TestUnion::Reader::getUnion3((Reader *)&f_3,(Reader *)local_4d8);
  local_89e[0] = capnproto_test::capnp::test::TestUnion::Union3::Reader::which((Reader *)&f_3);
  kj::_::DebugExpression<capnproto_test::capnp::test::TestUnion::Union3::Which>::operator==
            ((DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,_capnproto_test::capnp::test::TestUnion::Union3::Which>
              *)local_898,&local_89a,local_89e);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_898);
  if (bVar1) {
    local_948 = 0x112210f47de98115;
    local_940 = kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_948);
    capnproto_test::capnp::test::TestUnion::Reader::getUnion3
              ((Reader *)local_980,(Reader *)local_4d8);
    local_950 = capnproto_test::capnp::test::TestUnion::Union3::Reader::getU3f0s64
                          ((Reader *)local_980);
    kj::_::DebugExpression<long_long>::operator==
              ((DebugComparison<long_long,_long> *)local_938,&local_940,&local_950);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_938);
    func = extraout_RDX;
    if (!bVar1) {
      local_981 = kj::_::Debug::shouldLog(ERROR);
      func = extraout_RDX_00;
      while (local_981 != false) {
        local_990 = 0x112210f47de98115;
        capnproto_test::capnp::test::TestUnion::Reader::getUnion3
                  ((Reader *)&_kjCondition_8.result,(Reader *)local_4d8);
        local_998 = capnproto_test::capnp::test::TestUnion::Union3::Reader::getU3f0s64
                              ((Reader *)&_kjCondition_8.result);
        kj::_::Debug::log<char_const(&)[78],kj::_::DebugComparison<long_long,long>&,long_long,long>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x15f,ERROR,
                   "\"failed: expected \" \"(1234567890123456789ll) == (reader.getUnion3().getU3f0s64())\", _kjCondition, 1234567890123456789ll, reader.getUnion3().getU3f0s64()"
                   ,(char (*) [78])
                    "failed: expected (1234567890123456789ll) == (reader.getUnion3().getU3f0s64())",
                   (DebugComparison<long_long,_long> *)local_938,&local_990,&local_998);
        func = extraout_RDX_01;
        local_981 = false;
      }
    }
    _auStack_eb8 = local_130;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase331::run()::__0>
              (&local_eb0,(kj *)auStack_eb8,func);
    kj::_::DebugExpressionStart::operator<<
              (&local_d18,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_eb0);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
              ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b80,
               (DebugExpression<kj::Maybe<kj::Exception>> *)&local_d18,(None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_d18);
    kj::Maybe<kj::Exception>::~Maybe(&local_eb0);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b80);
    if (!bVar1) {
      _kjCondition_9._439_1_ = kj::_::Debug::shouldLog(ERROR);
      while (_kjCondition_9._439_1_ != '\0') {
        kj::_::Debug::
        log<char_const(&)[89],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x162,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.get(\\\"u0f1s32\\\"); }) != kj::none\", _kjCondition"
                   ,(char (*) [89])
                    "failed: expected ::kj::runCatchingExceptions([&]() { root.get(\"u0f1s32\"); }) != kj::none"
                   ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b80);
        _kjCondition_9._439_1_ = 0;
      }
    }
    kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
              ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_b80);
    _auStack_13b0 = local_130;
    kj::runCatchingExceptions<capnp::_::(anonymous_namespace)::TestCase331::run()::__1>
              (&local_13a8,(kj *)auStack_13b0,func_00);
    kj::_::DebugExpressionStart::operator<<
              (&local_1210,(DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_13a8);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>>::operator!=
              ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1078,
               (DebugExpression<kj::Maybe<kj::Exception>> *)&local_1210,(None *)&kj::none);
    kj::_::DebugExpression<kj::Maybe<kj::Exception>_>::~DebugExpression(&local_1210);
    kj::Maybe<kj::Exception>::~Maybe(&local_13a8);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1078);
    if (!bVar1) {
      local_13b1 = kj::_::Debug::shouldLog(ERROR);
      while (local_13b1 != false) {
        kj::_::Debug::
        log<char_const(&)[98],kj::_::DebugComparison<kj::Maybe<kj::Exception>,kj::None_const&>&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
                   ,0x163,ERROR,
                   "\"failed: expected \" \"::kj::runCatchingExceptions([&]() { root.set(\\\"u0f1s32\\\", 1234567); }) != kj::none\", _kjCondition"
                   ,(char (*) [98])
                    "failed: expected ::kj::runCatchingExceptions([&]() { root.set(\"u0f1s32\", 1234567); }) != kj::none"
                   ,(DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1078);
        local_13b1 = false;
      }
    }
    kj::_::DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&>::~DebugComparison
              ((DebugComparison<kj::Maybe<kj::Exception>,_const_kj::None_&> *)local_1078);
    MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&root.builder.dataSize);
    return;
  }
  local_8dc[1] = 4;
  capnproto_test::capnp::test::TestUnion::Reader::getUnion3
            ((Reader *)&_kjCondition_7.result,(Reader *)local_4d8);
  local_8dc[0] = capnproto_test::capnp::test::TestUnion::Union3::Reader::which
                           ((Reader *)&_kjCondition_7.result);
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>&,capnproto_test::capnp::test::TestUnion::Union3::Which,capnproto_test::capnp::test::TestUnion::Union3::Which>
            (&local_8d8,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-test.c++"
             ,0x15e,FAILED,"(TestUnion::Union3::U3F0S64) == (reader.getUnion3().which())",
             "_kjCondition,TestUnion::Union3::U3F0S64, reader.getUnion3().which()",
             (DebugComparison<capnproto_test::capnp::test::TestUnion::Union3::Which,_capnproto_test::capnp::test::TestUnion::Union3::Which>
              *)local_898,local_8dc + 1,local_8dc);
  kj::_::Debug::Fault::fatal(&local_8d8);
}

Assistant:

TEST(DynamicApi, UnionsWrite) {
  MallocMessageBuilder builder;
  auto root = builder.initRoot<DynamicStruct>(Schema::from<TestUnion>());

  root.get("union0").as<DynamicStruct>().set("u0f1s32", 1234567);
  root.get("union1").as<DynamicStruct>().set("u1f1sp", "foo");
  root.get("union2").as<DynamicStruct>().set("u2f0s1", true);
  root.get("union3").as<DynamicStruct>().set("u3f0s64", 1234567890123456789ll);

  auto reader = root.asReader().as<TestUnion>();
  ASSERT_EQ(TestUnion::Union0::U0F1S32, reader.getUnion0().which());
  EXPECT_EQ(1234567, reader.getUnion0().getU0f1s32());

  ASSERT_EQ(TestUnion::Union1::U1F1SP, reader.getUnion1().which());
  EXPECT_EQ("foo", reader.getUnion1().getU1f1sp());

  ASSERT_EQ(TestUnion::Union2::U2F0S1, reader.getUnion2().which());
  EXPECT_TRUE(reader.getUnion2().getU2f0s1());

  ASSERT_EQ(TestUnion::Union3::U3F0S64, reader.getUnion3().which());
  EXPECT_EQ(1234567890123456789ll, reader.getUnion3().getU3f0s64());

  // Can't access union members by name from the root.
  EXPECT_ANY_THROW(root.get("u0f1s32"));
  EXPECT_ANY_THROW(root.set("u0f1s32", 1234567));
}